

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O0

void __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::Consume::commit_consume_impl(Consume *this)

{
  Consume *this_local;
  
  raw_atomic_store(&this->m_control->m_next,this->m_next_ptr,memory_order_seq_cst);
  clean_dead_elements(this);
  this->m_next_ptr = 0;
  return;
}

Assistant:

void commit_consume_impl() noexcept
                {
#if DENSITY_DEBUG_INTERNAL
                    consume_dbg_checks();
#endif

                    // remove LfQueue_Busy and add LfQueue_Dead
                    raw_atomic_store(&m_control->m_next, m_next_ptr, mem_release);

                    clean_dead_elements();

                    m_next_ptr = 0;
                }